

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMapFileReaderTests.cpp
# Opt level: O0

int testMMapFileReaderTestsFileErrorEmpty(void)

{
  string *filename;
  ostream *poVar1;
  runtime_error *ex;
  MMapFileReader local_80;
  byte local_39;
  undefined1 local_38 [7];
  bool caughtCorrectException;
  AutoDeleteTempFile tempfile;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile((AutoDeleteTempFile *)local_38);
  local_39 = 0;
  filename = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                       ((AutoDeleteTempFile *)local_38);
  MILBlob::Blob::MMapFileReader::MMapFileReader(&local_80,filename);
  MILBlob::Blob::MMapFileReader::~MMapFileReader(&local_80);
  tempfile._36_1_ = (local_39 & 1) == 0;
  if ((bool)tempfile._36_1_) {
    poVar1 = std::operator<<((ostream *)&std::clog,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/MMapFileReaderTests.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x20);
    std::operator<<(poVar1,": expected exception, but none thrown.\n");
  }
  tempfile._37_3_ = 0;
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile((AutoDeleteTempFile *)local_38);
  return tempfile._36_4_;
}

Assistant:

int testMMapFileReaderTestsFileErrorEmpty()
{
    AutoDeleteTempFile tempfile;
    ML_ASSERT_THROWS_WITH_MESSAGE(MMapFileReader(tempfile.GetFilename()), std::runtime_error, "Unable to mmap");

    return 0;
}